

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

void Aig_Support_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vSupp)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  while( true ) {
    if (pObj->TravId == p->nTravIds) {
      return;
    }
    pObj->TravId = p->nTravIds;
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 != 0) {
      return;
    }
    uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar3 = uVar2 & 7;
    if (uVar3 == 2) {
      Vec_PtrPush(vSupp,pObj);
      return;
    }
    if ((uVar3 != 4) && (1 < (uVar2 & 7) - 5)) break;
    Aig_Support_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vSupp);
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    if (pObj == (Aig_Obj_t *)0x0) {
      return;
    }
  }
  __assert_fail("Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDfs.c"
                ,0x33d,"void Aig_Support_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Aig_Support_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vSupp )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_PtrPush( vSupp, pObj );
        return;
    }
    assert( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) );
    Aig_Support_rec( p, Aig_ObjFanin0(pObj), vSupp );
    if ( Aig_ObjFanin1(pObj) )
        Aig_Support_rec( p, Aig_ObjFanin1(pObj), vSupp );
}